

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_crypt.c
# Opt level: O2

int ulp_ring_encrypt(uint8_t *msg,ulp_ring_public_key *pub_key,ulp_ring_ciphertext **ciphertext_p)

{
  size_t __size;
  size_t count;
  int iVar1;
  int iVar2;
  int iVar3;
  ulp_ring_ciphertext *ciphertext;
  uint64_t *buffer;
  uint64_t *result;
  uint64_t *out;
  size_t i;
  ulong uVar4;
  undefined1 auVar5 [16];
  
  if (pub_key != (ulp_ring_public_key *)0x0 && msg != (uint8_t *)0x0) {
    ciphertext = ulp_ring_alloc_ciphertext(pub_key->n);
    count = pub_key->n;
    __size = count * 8;
    buffer = (uint64_t *)malloc(__size);
    result = (uint64_t *)malloc(__size);
    out = (uint64_t *)malloc(__size);
    auVar5._0_4_ = -(uint)((int)((ulong)ciphertext >> 0x20) == 0 && (int)ciphertext == 0);
    auVar5._4_4_ = -(uint)((int)buffer == 0 && (int)((ulong)buffer >> 0x20) == 0);
    auVar5._8_4_ = -(uint)((int)((ulong)result >> 0x20) == 0 && (int)result == 0);
    auVar5._12_4_ = -(uint)((int)out == 0 && (int)((ulong)out >> 0x20) == 0);
    iVar1 = movmskps((int)out,auVar5);
    if (iVar1 == 0) {
      iVar1 = get_random_numbers(buffer,count,pub_key->se);
      iVar2 = get_random_numbers(ciphertext->c1,pub_key->n,pub_key->se);
      iVar3 = get_random_numbers(ciphertext->c2,pub_key->n,pub_key->se);
      if (iVar3 + iVar2 + iVar1 == 0) {
        encode(msg,out,pub_key->n,pub_key->q);
        iVar1 = poly_mulmod(pub_key->a,buffer,pub_key->n,pub_key->q,result);
        if (iVar1 == 0) {
          for (uVar4 = 0; uVar4 < pub_key->n; uVar4 = uVar4 + 1) {
            ciphertext->c1[uVar4] = (result[uVar4] + ciphertext->c1[uVar4]) % pub_key->q;
          }
          iVar1 = poly_mulmod(pub_key->p,buffer,pub_key->n,pub_key->q,result);
          if (iVar1 == 0) {
            for (uVar4 = 0; uVar4 < pub_key->n; uVar4 = uVar4 + 1) {
              ciphertext->c2[uVar4] =
                   (result[uVar4] + ciphertext->c2[uVar4] + out[uVar4]) % pub_key->q;
            }
            free(buffer);
            free(result);
            free(out);
            *ciphertext_p = ciphertext;
            return 0;
          }
        }
      }
    }
    ulp_ring_free_ciphertext(ciphertext);
    free(buffer);
    free(result);
    free(out);
  }
  return -1;
}

Assistant:

int ulp_ring_encrypt(uint8_t msg[], ulp_ring_public_key* pub_key, ulp_ring_ciphertext** ciphertext_p) {

    if(msg == NULL || pub_key == NULL)
        return -1;

    // allocate memory for ciphertext and other buffers
    ulp_ring_ciphertext* ciphertext = ulp_ring_alloc_ciphertext(pub_key->n);
    uint64_t* e1 = malloc(pub_key->n * sizeof(pub_key->se));
    uint64_t* mul_tmp = malloc(pub_key->n * sizeof(pub_key->q));
    uint64_t* encoded = malloc(pub_key->n * sizeof(pub_key->q));
    if(ciphertext == NULL || e1 == NULL || mul_tmp == NULL || encoded == NULL)
        goto fail;

    // gather random data for e1, e2 and e3
    int err = 0;
    err += get_random_numbers(e1, pub_key->n, pub_key->se);
    err += get_random_numbers(ciphertext->c1, pub_key->n, pub_key->se);
    err += get_random_numbers(ciphertext->c2, pub_key->n, pub_key->se);
    if(err != 0)
        goto fail;

    // encode input
    encode(msg, encoded, pub_key->n, pub_key->q);

    // c1 = a*e1 + e2
    if(poly_mulmod(pub_key->a, e1, pub_key->n, pub_key->q, mul_tmp) != 0)
        goto fail;
    for(size_t i = 0; i < pub_key->n; i++) {
        ciphertext->c1[i] = (ciphertext->c1[i] + mul_tmp[i]) % pub_key->q;
    }

    // c2 = p*e1 + e3 + encoded(msg)
    if(poly_mulmod(pub_key->p, e1, pub_key->n, pub_key->q, mul_tmp) != 0)
        goto fail;
    for(size_t i = 0; i < pub_key->n; i++) {
        ciphertext->c2[i] = (ciphertext->c2[i] + mul_tmp[i] + encoded[i]) % pub_key->q;
    }

    // exit properly
    free(e1);
    free(mul_tmp);
    free(encoded);
    *ciphertext_p = ciphertext;
    return 0;


    fail:
        ulp_ring_free_ciphertext(ciphertext);
        free(e1);
        free(mul_tmp);
        free(encoded);
        return -1;

}